

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
CompilerIdNode::EvaluateWithLanguage
          (string *__return_storage_ptr__,CompilerIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4,string *lang)

{
  cmMakefile *this_00;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  char *__s2;
  cmake *this_01;
  PolicyID id;
  char *pcVar5;
  allocator local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream e;
  
  this_00 = context->LG->Makefile;
  std::operator+(&local_1c8,"CMAKE_",lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,&local_1c8,
                 "_COMPILER_ID");
  __s2 = cmMakefile::GetSafeDefinition(this_00,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&local_1c8);
  if ((parameters->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (parameters->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar5 = "";
    if (__s2 != (char *)0x0) {
      pcVar5 = __s2;
    }
    goto LAB_0031e7d0;
  }
  if ((EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
       ::compilerIdValidator == '\0') &&
     (iVar3 = __cxa_guard_acquire(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                                   ::compilerIdValidator), iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&EvaluateWithLanguage::compilerIdValidator,"^[A-Za-z0-9_]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                 &EvaluateWithLanguage::compilerIdValidator,&__dso_handle);
    __cxa_guard_release(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                         ::compilerIdValidator);
  }
  bVar2 = cmsys::RegularExpression::find
                    (&EvaluateWithLanguage::compilerIdValidator,
                     (parameters->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  if (!bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&e,content);
    std::__cxx11::string::string
              ((string *)&local_1c8,"Expression syntax not recognized.",&local_1c9);
    reportError(context,(string *)&e,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&e);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (__s2 == (char *)0x0) {
    pcVar5 = "0";
    if (pbVar1->_M_string_length == 0) {
      pcVar5 = "1";
    }
    goto LAB_0031e7d0;
  }
  pcVar5 = (pbVar1->_M_dataplus)._M_p;
  iVar3 = strcmp(pcVar5,__s2);
  if (iVar3 != 0) {
    iVar3 = cmsysString_strcasecmp(pcVar5,__s2);
    if (iVar3 != 0) {
LAB_0031e699:
      pcVar5 = "0";
      goto LAB_0031e7d0;
    }
    PVar4 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0044);
    if (PVar4 != OLD) {
      if (PVar4 != WARN) goto LAB_0031e699;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x2c,id);
      std::operator<<((ostream *)&e,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      this_01 = cmLocalGenerator::GetCMakeInstance(context->LG);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_1c8,&context->Backtrace,false);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
  }
  pcVar5 = "1";
LAB_0031e7d0:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)&e);
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateWithLanguage(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *,
                       const std::string &lang) const
  {
    const char *compilerId =
      context->LG->GetMakefile()
        ->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID");
    if (parameters.empty())
      {
      return compilerId ? compilerId : "";
      }
    static cmsys::RegularExpression compilerIdValidator("^[A-Za-z0-9_]*$");
    if (!compilerIdValidator.find(*parameters.begin()))
      {
      reportError(context, content->GetOriginalExpression(),
                  "Expression syntax not recognized.");
      return std::string();
      }
    if (!compilerId)
      {
      return parameters.front().empty() ? "1" : "0";
      }

    if (strcmp(parameters.begin()->c_str(), compilerId) == 0)
      {
      return "1";
      }

    if (cmsysString_strcasecmp(parameters.begin()->c_str(), compilerId) == 0)
      {
      switch(context->LG->GetPolicyStatus(cmPolicies::CMP0044))
        {
        case cmPolicies::WARN:
          {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0044);
          context->LG->GetCMakeInstance()
                 ->IssueMessage(cmake::AUTHOR_WARNING,
                                e.str(), context->Backtrace);
          }
        case cmPolicies::OLD:
          return "1";
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
        }
      }
    return "0";
  }